

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O2

int blake2s_init_key(blake2s_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  blake2s_param local_88;
  uint8_t block [64];
  
  iVar1 = -1;
  if ((0xffffffffffffffdf < outlen - 0x21) &&
     (0xffffffffffffffdf < keylen - 0x21 && key != (void *)0x0)) {
    local_88.digest_length = (uint8_t)outlen;
    local_88.key_length = (uint8_t)keylen;
    local_88.fanout = '\x01';
    local_88.depth = '\x01';
    local_88.leaf_length = 0;
    local_88.node_offset = 0;
    local_88.xof_length = 0;
    local_88.node_depth = '\0';
    local_88.inner_length = '\0';
    local_88.salt[0] = '\0';
    local_88.salt[1] = '\0';
    local_88.salt[2] = '\0';
    local_88.salt[3] = '\0';
    local_88.salt[4] = '\0';
    local_88.salt[5] = '\0';
    local_88.salt[6] = '\0';
    local_88.salt[7] = '\0';
    local_88.personal[0] = '\0';
    local_88.personal[1] = '\0';
    local_88.personal[2] = '\0';
    local_88.personal[3] = '\0';
    local_88.personal[4] = '\0';
    local_88.personal[5] = '\0';
    local_88.personal[6] = '\0';
    local_88.personal[7] = '\0';
    blake2s_init_param(S,&local_88);
    block[0x30] = '\0';
    block[0x31] = '\0';
    block[0x32] = '\0';
    block[0x33] = '\0';
    block[0x34] = '\0';
    block[0x35] = '\0';
    block[0x36] = '\0';
    block[0x37] = '\0';
    block[0x38] = '\0';
    block[0x39] = '\0';
    block[0x3a] = '\0';
    block[0x3b] = '\0';
    block[0x3c] = '\0';
    block[0x3d] = '\0';
    block[0x3e] = '\0';
    block[0x3f] = '\0';
    block[0x20] = '\0';
    block[0x21] = '\0';
    block[0x22] = '\0';
    block[0x23] = '\0';
    block[0x24] = '\0';
    block[0x25] = '\0';
    block[0x26] = '\0';
    block[0x27] = '\0';
    block[0x28] = '\0';
    block[0x29] = '\0';
    block[0x2a] = '\0';
    block[0x2b] = '\0';
    block[0x2c] = '\0';
    block[0x2d] = '\0';
    block[0x2e] = '\0';
    block[0x2f] = '\0';
    block[0x10] = '\0';
    block[0x11] = '\0';
    block[0x12] = '\0';
    block[0x13] = '\0';
    block[0x14] = '\0';
    block[0x15] = '\0';
    block[0x16] = '\0';
    block[0x17] = '\0';
    block[0x18] = '\0';
    block[0x19] = '\0';
    block[0x1a] = '\0';
    block[0x1b] = '\0';
    block[0x1c] = '\0';
    block[0x1d] = '\0';
    block[0x1e] = '\0';
    block[0x1f] = '\0';
    block[0] = '\0';
    block[1] = '\0';
    block[2] = '\0';
    block[3] = '\0';
    block[4] = '\0';
    block[5] = '\0';
    block[6] = '\0';
    block[7] = '\0';
    block[8] = '\0';
    block[9] = '\0';
    block[10] = '\0';
    block[0xb] = '\0';
    block[0xc] = '\0';
    block[0xd] = '\0';
    block[0xe] = '\0';
    block[0xf] = '\0';
    memcpy(block,key,keylen);
    blake2s_update(S,block,0x40);
    iVar1 = 0;
    memset(block,0,0x40);
  }
  return iVar1;
}

Assistant:

int blake2s_init_key( blake2s_state *S, size_t outlen, const void *key, size_t keylen )
{
  blake2s_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2S_OUTBYTES ) ) return -1;

  if ( !key || !keylen || keylen > BLAKE2S_KEYBYTES ) return -1;

  P->digest_length = (uint8_t)outlen;
  P->key_length    = (uint8_t)keylen;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  /* memset(P->reserved, 0, sizeof(P->reserved) ); */
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );

  if( blake2s_init_param( S, P ) < 0 ) return -1;

  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );
    blake2s_update( S, block, BLAKE2S_BLOCKBYTES );
    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}